

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O1

string_t * __thiscall
cfgfile::tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,cfgfile::string_trait_t>::
print_abi_cxx11_(string_t *__return_storage_ptr__,void *this,int indent)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 *puVar3;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this);
  if (bVar2) {
    puVar3 = *(undefined8 **)((long)this + 0x60);
    puVar1 = *(undefined8 **)((long)this + 0x68);
    if (puVar3 != puVar1) {
      do {
        (**(code **)(*(long *)*puVar3 + 0x18))(local_50,(long *)*puVar3,indent);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        puVar3 = puVar3 + 2;
      } while (puVar3 != puVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			for( const ptr_to_tag_t & p : m_tags )
				result.append( p->print( indent ) );
		}

		return result;
	}